

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_mul(POLY_MUL_SCRATCH *scratch,poly *r,poly *a,poly *b)

{
  int iVar1;
  poly *b_local;
  poly *a_local;
  poly *r_local;
  POLY_MUL_SCRATCH *scratch_local;
  
  iVar1 = CRYPTO_is_AVX2_capable();
  if (iVar1 == 0) {
    iVar1 = vec_capable();
    if (iVar1 == 0) {
      poly_mul_novec(scratch,r,a,b);
    }
    else {
      poly_mul_vec(scratch,r,a,b);
    }
  }
  else {
    poly_Rq_mul(r,a,b,scratch);
    poly_normalize(r);
  }
  poly_assert_normalized(r);
  return;
}

Assistant:

static void poly_mul(struct POLY_MUL_SCRATCH *scratch, struct poly *r,
                     const struct poly *a, const struct poly *b) {
#if defined(POLY_RQ_MUL_ASM)
  if (CRYPTO_is_AVX2_capable()) {
    poly_Rq_mul(r->v, a->v, b->v, scratch->u.rq);
    poly_normalize(r);
  } else
#endif

#if defined(HRSS_HAVE_VECTOR_UNIT)
      if (vec_capable()) {
    poly_mul_vec(scratch, r, a, b);
  } else
#endif

  // Fallback, non-vector case.
  {
    poly_mul_novec(scratch, r, a, b);
  }

  poly_assert_normalized(r);
}